

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorBetweenUnitsSameNameLostChildren_Test::
~Units_scalingFactorBetweenUnitsSameNameLostChildren_Test
          (Units_scalingFactorBetweenUnitsSameNameLostChildren_Test *this)

{
  Units_scalingFactorBetweenUnitsSameNameLostChildren_Test *this_local;
  
  ~Units_scalingFactorBetweenUnitsSameNameLostChildren_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsSameNameLostChildren)
{
    auto model1 = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("oranges");
    model1->addUnits(u1);

    auto model2 = model1->clone();
    auto u2 = model2->units(0);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(0.0, scaling);
}